

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnotAli.cc
# Opt level: O3

void updateVectors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *seqs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *seqs2,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *names,string *input_file,string *input_type)

{
  pointer pcVar1;
  pointer pbVar2;
  size_type sVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  long *plVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  istream *piVar10;
  size_type *psVar11;
  ulong uVar12;
  size_type sVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  long lVar16;
  bool bVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar18;
  size_type sVar19;
  string str;
  string temp;
  string type;
  string temp2;
  istringstream ss;
  ifstream in;
  value_type local_468;
  uint local_444;
  ulong local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_408;
  long *local_400;
  long local_3f8;
  long local_3f0 [2];
  long local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_400 = local_3f0;
  pcVar1 = (input_type->_M_dataplus)._M_p;
  local_438 = seqs;
  local_430 = seqs2;
  local_408 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar1,pcVar1 + input_type->_M_string_length);
  plVar5 = local_400;
  if (local_3f8 != 0) {
    lVar16 = 0;
    do {
      iVar8 = toupper((int)*(char *)((long)plVar5 + lVar16));
      *(char *)((long)plVar5 + lVar16) = (char)iVar8;
      lVar16 = lVar16 + 1;
    } while (local_3f8 != lVar16);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_400);
  if (iVar8 == 0) {
    std::ifstream::ifstream((istream *)local_238,(input_file->_M_dataplus)._M_p,_S_in);
    local_3b8[0]._M_dataplus._M_p = (pointer)&local_3b8[0].field_2;
    local_3b8[0]._M_string_length = 0;
    local_3b8[0].field_2._M_local_buf[0] = '\0';
    local_444 = 0xffffffff;
    do {
      local_440 = (ulong)(int)local_444;
      while( true ) {
        bVar17 = false;
        while( true ) {
          cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_238,(string *)local_3b8,cVar6);
          sVar3 = local_3b8[0]._M_string_length;
          _Var15._M_p = local_3b8[0]._M_dataplus._M_p;
          if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
            std::ifstream::close();
            pvVar18 = local_438;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8[0]._M_dataplus._M_p == &local_3b8[0].field_2) goto LAB_00118288;
            lVar16 = CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                              local_3b8[0].field_2._M_local_buf[0]);
            _Var15._M_p = local_3b8[0]._M_dataplus._M_p;
            goto LAB_00118280;
          }
          if (*local_3b8[0]._M_dataplus._M_p != '>') break;
          std::__cxx11::string::substr((ulong)&local_468,(ulong)local_3b8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_408,&local_468);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p,
                            CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                     local_468.field_2._M_local_buf[0]) + 1);
          }
          bVar17 = true;
        }
        if (bVar17) break;
        if (local_3b8[0]._M_string_length == 0) {
          sVar13 = 0;
        }
        else {
          sVar19 = 0;
          do {
            iVar8 = toupper((int)_Var15._M_p[sVar19]);
            _Var15._M_p[sVar19] = (char)iVar8;
            sVar19 = sVar19 + 1;
            sVar13 = local_3b8[0]._M_string_length;
          } while (sVar3 != sVar19);
        }
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_468,local_3b8[0]._M_dataplus._M_p,
                   local_3b8[0]._M_dataplus._M_p + sVar13);
        if (-1 < (int)((int)local_468._M_string_length - 1U)) {
          uVar14 = (ulong)((int)local_468._M_string_length - 1U);
          do {
            if (local_468._M_dataplus._M_p[uVar14] == '-') {
              std::__cxx11::string::erase((ulong)&local_468,uVar14);
            }
            bVar17 = 0 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar17);
        }
        pvVar18 = local_430;
        uVar14 = local_440;
        std::operator+(&local_428,
                       (local_430->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_440,&local_468);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((pvVar18->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar14));
        pvVar18 = local_438;
        std::operator+(&local_3d8,
                       (local_438->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar14,local_3b8);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((pvVar18->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar14));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,
                          CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                   local_468.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_3b8[0]._M_string_length == 0) {
        sVar13 = 0;
      }
      else {
        sVar19 = 0;
        do {
          iVar8 = toupper((int)_Var15._M_p[sVar19]);
          _Var15._M_p[sVar19] = (char)iVar8;
          sVar19 = sVar19 + 1;
          sVar13 = local_3b8[0]._M_string_length;
        } while (sVar3 != sVar19);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3b8[0]._M_dataplus._M_p,
                 local_3b8[0]._M_dataplus._M_p + sVar13);
      pvVar18 = local_438;
      if (-1 < (int)((int)local_468._M_string_length - 1U)) {
        uVar14 = (ulong)((int)local_468._M_string_length - 1U);
        do {
          if (local_468._M_dataplus._M_p[uVar14] == '-') {
            std::__cxx11::string::erase((ulong)&local_468,uVar14);
          }
          bVar17 = 0 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar17);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_430,&local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar18,local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,
                        CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                 local_468.field_2._M_local_buf[0]) + 1);
      }
      local_444 = local_444 + 1;
    } while( true );
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_400);
  pvVar18 = local_438;
  if (iVar8 == 0) {
    std::ifstream::ifstream(local_238,(input_file->_M_dataplus)._M_p,_S_in);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_468._M_string_length = 0;
    local_468.field_2._M_local_buf[0] = '\0';
    cVar6 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_468,cVar6);
    std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_468);
    iVar8 = std::__cxx11::string::compare((char *)local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
      operator_delete(local_3b8[0]._M_dataplus._M_p,
                      CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                               local_3b8[0].field_2._M_local_buf[0]) + 1);
    }
    if (iVar8 == 0) {
      cVar6 = std::ios::widen((char)(istream *)local_238 +
                              (char)*(undefined8 *)(local_238[0] + -0x18));
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_468,cVar6);
      local_440 = CONCAT44(local_440._4_4_,(int)CONCAT71((int7)((ulong)piVar10 >> 8),1));
      do {
        local_444 = 0;
        while( true ) {
          do {
            cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                    (char)(istream *)local_238);
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_468,cVar6);
            if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
              std::ifstream::close();
              goto LAB_0011826d;
            }
          } while ((*(pointer *)(local_408 + 8) == *(pointer *)local_408) &&
                  (iVar8 = std::__cxx11::string::compare((char *)&local_468), iVar8 == 0));
          iVar8 = std::__cxx11::string::compare((char *)&local_468);
          if ((iVar8 == 0) || (*local_468._M_dataplus._M_p == ' ')) break;
          if ((local_440 & 1) == 0) {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_3b8,(string *)&local_468,_S_in);
            std::operator>>((istream *)local_3b8,(string *)&local_468);
            std::operator>>((istream *)local_3b8,(string *)&local_468);
            sVar3 = local_468._M_string_length;
            _Var15._M_p = local_468._M_dataplus._M_p;
            if (local_468._M_string_length != 0) {
              sVar13 = 0;
              do {
                iVar8 = toupper((int)_Var15._M_p[sVar13]);
                _Var15._M_p[sVar13] = (char)iVar8;
                sVar13 = sVar13 + 1;
              } while (sVar3 != sVar13);
            }
            pvVar18 = local_438;
            uVar14 = (ulong)local_444;
            std::operator+(&local_428,
                           (local_438->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar14,&local_468);
            local_3e0 = uVar14 * 0x20;
            std::__cxx11::string::operator=
                      ((string *)
                       ((pvVar18->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar14),(string *)&local_428);
            pvVar4 = local_430;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1
                             );
            }
            if (-1 < (int)((int)local_468._M_string_length - 1U)) {
              uVar14 = (ulong)((int)local_468._M_string_length - 1U);
              do {
                if (local_468._M_dataplus._M_p[uVar14] == '-') {
                  std::__cxx11::string::erase((ulong)&local_468,uVar14);
                }
                bVar17 = 0 < (long)uVar14;
                uVar14 = uVar14 - 1;
              } while (bVar17);
            }
            lVar16 = local_3e0;
            std::operator+(&local_428,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((pvVar4->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + local_3e0),&local_468);
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&(((pvVar4->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar16),(string *)&local_428);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1
                             );
            }
            local_444 = local_444 + 1;
            std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
            std::ios_base::~ios_base(local_340);
          }
          else {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_3b8,(string *)&local_468,_S_in);
            std::operator>>((istream *)local_3b8,(string *)&local_468);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_408,&local_468);
            std::operator>>((istream *)local_3b8,(string *)&local_468);
            sVar3 = local_468._M_string_length;
            _Var15._M_p = local_468._M_dataplus._M_p;
            if (local_468._M_string_length != 0) {
              sVar13 = 0;
              do {
                iVar8 = toupper((int)_Var15._M_p[sVar13]);
                _Var15._M_p[sVar13] = (char)iVar8;
                sVar13 = sVar13 + 1;
              } while (sVar3 != sVar13);
            }
            pvVar18 = local_438;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_438,&local_468);
            pvVar4 = local_430;
            if (-1 < (int)((int)local_468._M_string_length - 1U)) {
              uVar14 = (ulong)((int)local_468._M_string_length - 1U);
              do {
                if (local_468._M_dataplus._M_p[uVar14] == '-') {
                  std::__cxx11::string::erase((ulong)&local_468,uVar14);
                }
                bVar17 = 0 < (long)uVar14;
                uVar14 = uVar14 - 1;
              } while (bVar17);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pvVar4,&local_468);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
            std::ios_base::~ios_base(local_340);
          }
        }
        local_440 = local_440 & 0xffffffff00000000;
      } while( true );
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not a valid CLUSTAL file!",0x19);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)&local_400);
    if (iVar8 == 0) {
      std::ifstream::ifstream(local_238,(input_file->_M_dataplus)._M_p,_S_in);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      local_468._M_string_length = 0;
      local_468.field_2._M_local_buf[0] = '\0';
      cVar6 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_468,cVar6);
      cVar6 = std::ios::widen((char)(istream *)local_238 +
                              (char)*(undefined8 *)(local_238[0] + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_468,cVar6);
      while( true ) {
        std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_468);
        iVar8 = std::__cxx11::string::compare((char *)local_3b8);
        paVar9 = &local_3b8[0].field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0]._M_dataplus._M_p != paVar9) {
          operator_delete(local_3b8[0]._M_dataplus._M_p,
                          CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                                   local_3b8[0].field_2._M_local_buf[0]) + 1);
          paVar9 = extraout_RAX;
        }
        cVar6 = (char)(istream *)local_238;
        if (iVar8 != 0) break;
        cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar6);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_468,cVar6);
      }
      local_440 = CONCAT44(local_440._4_4_,(int)CONCAT71((int7)((ulong)paVar9 >> 8),1));
LAB_001178a9:
      local_444 = 0;
      do {
        cVar7 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar6);
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_468,cVar7);
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
LAB_0011826d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            lVar16 = CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                              local_468.field_2._M_local_buf[0]);
            _Var15._M_p = local_468._M_dataplus._M_p;
LAB_00118280:
            operator_delete(_Var15._M_p,lVar16 + 1);
          }
LAB_00118288:
          std::ifstream::~ifstream(local_238);
          pbVar2 = (pvVar18->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar16 = (long)(pvVar18->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
          if (lVar16 != 0) {
            lVar16 = lVar16 >> 5;
            psVar11 = &pbVar2->_M_string_length;
            lVar16 = lVar16 + (ulong)(lVar16 == 0);
            do {
              if (*psVar11 != (long)(int)pbVar2->_M_string_length) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "All sequences must be the same length in the alignment",0x36);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                exit(0);
              }
              psVar11 = psVar11 + 4;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          if (local_400 != local_3f0) {
            operator_delete(local_400,local_3f0[0] + 1);
          }
          return;
        }
        std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_468);
        iVar8 = std::__cxx11::string::compare((char *)local_3b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
          operator_delete(local_3b8[0]._M_dataplus._M_p,
                          CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                                   local_3b8[0].field_2._M_local_buf[0]) + 1);
        }
        if (iVar8 == 0) goto LAB_0011826d;
        iVar8 = std::__cxx11::string::compare((char *)&local_468);
        if ((iVar8 == 0) || (*local_468._M_dataplus._M_p == ' ')) goto LAB_00117b46;
        if ((local_440 & 1) == 0) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_3b8,(string *)&local_468,_S_in);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          sVar3 = local_468._M_string_length;
          _Var15._M_p = local_468._M_dataplus._M_p;
          if (local_468._M_string_length != 0) {
            sVar13 = 0;
            do {
              iVar8 = toupper((int)_Var15._M_p[sVar13]);
              _Var15._M_p[sVar13] = (char)iVar8;
              sVar13 = sVar13 + 1;
            } while (sVar3 != sVar13);
          }
          pvVar18 = local_438;
          uVar14 = (ulong)local_444;
          std::operator+(&local_428,
                         (local_438->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar14,&local_468);
          std::__cxx11::string::operator=
                    ((string *)
                     ((pvVar18->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar14),(string *)&local_428);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
          if (-1 < (int)((int)local_468._M_string_length - 1U)) {
            uVar12 = (ulong)((int)local_468._M_string_length - 1U);
            do {
              if (local_468._M_dataplus._M_p[uVar12] == '-') {
                std::__cxx11::string::erase((ulong)&local_468,uVar12);
              }
              bVar17 = 0 < (long)uVar12;
              uVar12 = uVar12 - 1;
            } while (bVar17);
          }
          pvVar4 = local_430;
          std::operator+(&local_428,
                         (local_430->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar14,&local_468);
          std::__cxx11::string::operator=
                    ((string *)
                     ((pvVar4->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar14),(string *)&local_428);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
          local_444 = local_444 + 1;
        }
        else {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_3b8,(string *)&local_468,_S_in);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_408,&local_468);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          sVar3 = local_468._M_string_length;
          _Var15._M_p = local_468._M_dataplus._M_p;
          if (local_468._M_string_length != 0) {
            sVar13 = 0;
            do {
              iVar8 = toupper((int)_Var15._M_p[sVar13]);
              _Var15._M_p[sVar13] = (char)iVar8;
              sVar13 = sVar13 + 1;
            } while (sVar3 != sVar13);
          }
          pvVar18 = local_438;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_438,&local_468);
          if (-1 < (int)((int)local_468._M_string_length - 1U)) {
            uVar14 = (ulong)((int)local_468._M_string_length - 1U);
            do {
              if (local_468._M_dataplus._M_p[uVar14] == '-') {
                std::__cxx11::string::erase((ulong)&local_468,uVar14);
              }
              bVar17 = 0 < (long)uVar14;
              uVar14 = uVar14 - 1;
            } while (bVar17);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_430,&local_468);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
      } while( true );
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please give valid input type",0x1c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(1);
LAB_00117b46:
  local_440 = local_440 & 0xffffffff00000000;
  goto LAB_001178a9;
}

Assistant:

void updateVectors(std::vector<std::string> & seqs, std::vector<std::string> &seqs2, std::vector<std::string> & names, const std::string & input_file, const std::string& input_type){
    std::string type = input_type;
    std::transform(type.begin(), type.end(), type.begin(), ::toupper);
    // Get the arguments
    if(type == "FASTA"){

        std::ifstream in(input_file.c_str());
        std::string str;
        int i = -1;
        bool newSeq = false;
        while (std::getline(in, str)) {

            if(str[0] == '>'){
                newSeq = true;
                names.push_back(str.substr(1,str.length()));
                continue;
            } 
            
            if(newSeq == true) {
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);

                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                seqs2.push_back(str2);
                seqs.push_back(str);
                i++;
                newSeq = false;
            }
            else{
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                std::string temp = seqs2[i] + str2;
                seqs2[i] = temp;
                std::string temp2 = seqs[i] + str;
                seqs[i] = temp2;
            }
        }
        in.close();

    }else if(type == "CLUSTAL"){
        
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;

        bool first = true;
        std::getline(in, str);
        if(str.substr(0,7) != "CLUSTAL"){
            std::cout << "Not a valid CLUSTAL file!" << std::endl;
            exit (EXIT_FAILURE);
        }
        std::getline(in, str);
        while (std::getline(in, str)) {
            if(names.size() == 0 && str == "") continue;

            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }
        in.close();
    }
    else if(type == "STOCKHOLM"){
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;
        bool first = true;
        std::getline(in,str);
        getline(in,str);
        while(str.substr(0,4) == "#=GF"){
            getline(in,str);
        }
        while(getline(in,str)){

            if(str.substr(0,4) == "#=GC") break;
            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }

    }
    else{
        std::cout << "Please give valid input type" << std::endl;
        exit (EXIT_FAILURE);
    }
    int length = seqs[0].length();
    for(int i=0;i<seqs.size();++i){
        if (seqs[i].length() != length){
            std::cout << "All sequences must be the same length in the alignment" << std::endl;
            exit(0);
        }
    }
}